

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_up_all
          (Omega_h *this,Mesh *mesh,Int low_dim,Int high_dim,Read<signed_char> *low_marked)

{
  int *piVar1;
  Alloc *pAVar2;
  LO size_in;
  void *pvVar3;
  undefined *puVar4;
  void *extraout_RDX;
  long lVar5;
  undefined1 uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  Read<signed_char> RVar10;
  Write<signed_char> out;
  LOs hl2l;
  type f;
  Adj l2h;
  Write<signed_char> local_138;
  Alloc *local_128;
  void *local_120;
  Write<signed_char> local_118;
  uint local_108 [2];
  Alloc *local_100;
  void *local_f8;
  Alloc *local_f0;
  void *local_e8;
  Alloc *local_e0;
  void *local_d8;
  string local_d0;
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  uint local_98 [2];
  Alloc *local_90;
  void *pvStack_88;
  Alloc *local_80;
  void *pvStack_78;
  Alloc *local_70;
  void *pvStack_68;
  Adj local_60;
  
  Mesh::ask_down(&local_60,mesh,high_dim,low_dim);
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    switch(high_dim) {
    case 0:
      uVar8 = 1;
      goto LAB_0031478a;
    case 1:
      goto switchD_003146f1_caseD_1;
    case 2:
      uVar8 = 3;
      goto LAB_0031475e;
    case 3:
      bVar9 = low_dim == 3;
      if ((uint)low_dim < 3) {
        puVar4 = &DAT_0045659c;
        goto LAB_00314776;
      }
      break;
    default:
      goto switchD_003146f1_default;
    }
  }
  else {
    switch(high_dim) {
    case 0:
      uVar8 = -(uint)(low_dim != 0) | 1;
      goto LAB_0031478a;
    case 1:
switchD_003146f1_caseD_1:
      if (low_dim == 0) {
        uVar8 = 2;
        goto LAB_0031478a;
      }
      bVar9 = low_dim == 1;
      break;
    case 2:
      uVar8 = 4;
LAB_0031475e:
      bVar9 = low_dim == 2;
      if ((uint)low_dim < 2) goto LAB_0031478a;
      break;
    case 3:
      bVar9 = low_dim == 3;
      if ((uint)low_dim < 3) {
        puVar4 = &DAT_004565a8;
LAB_00314776:
        uVar8 = *(uint *)(puVar4 + (ulong)(uint)low_dim * 4);
        goto LAB_0031478a;
      }
      break;
    default:
switchD_003146f1_default:
      uVar8 = 0xffffffff;
      goto LAB_0031478a;
    }
  }
  uVar8 = (uint)bVar9 * 2 - 1;
LAB_0031478a:
  local_128 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  size_in = Mesh::nents(mesh,high_dim);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  Write<signed_char>::Write(&local_138,size_in,'\0',&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_100 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_f8 = local_120;
  local_f0 = (low_marked->write_).shared_alloc_.alloc;
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_e8 = (low_marked->write_).shared_alloc_.direct_ptr;
  local_e0 = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)((local_138.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_138.shared_alloc_.alloc)->use_count = (local_138.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8 = local_138.shared_alloc_.direct_ptr;
  local_90 = local_100;
  if (((ulong)local_100 & 7) == 0 && local_100 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_100->size * 8 + 1);
    }
    else {
      local_100->use_count = local_100->use_count + 1;
    }
  }
  pvStack_88 = local_120;
  local_80 = local_f0;
  if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_f0->size * 8 + 1);
    }
    else {
      local_f0->use_count = local_f0->use_count + 1;
    }
  }
  local_70 = local_e0;
  if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(local_e0->size * 8 + 1);
    }
    else {
      local_e0->use_count = local_e0->use_count + 1;
    }
  }
  pvStack_68 = local_138.shared_alloc_.direct_ptr;
  local_108[0] = uVar8;
  local_98[0] = uVar8;
  pvStack_78 = local_e8;
  if (0 < size_in) {
    local_d0._M_dataplus._M_p._0_4_ = uVar8;
    local_d0._M_string_length = (size_type)local_90;
    local_d0.field_2._M_allocated_capacity = (size_type)local_120;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      local_90->use_count = local_90->use_count + -1;
      local_d0._M_string_length = local_90->size * 8 + 1;
    }
    local_90 = (Alloc *)0x0;
    pvStack_88 = (void *)0x0;
    local_d0.field_2._8_8_ = local_80;
    if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
      local_80->use_count = local_80->use_count + -1;
      local_d0.field_2._8_8_ = local_80->size * 8 + 1;
    }
    local_80 = (Alloc *)0x0;
    pvStack_78 = (void *)0x0;
    local_a8 = local_70;
    local_a0 = local_138.shared_alloc_.direct_ptr;
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      local_70->use_count = local_70->use_count + -1;
      local_a8 = (Alloc *)(local_70->size * 8 + 1);
    }
    local_70 = (Alloc *)0x0;
    pvStack_68 = (void *)0x0;
    entering_parallel = '\0';
    lVar5 = 0;
    pvVar3 = local_120;
    do {
      uVar6 = 1;
      if (0 < (int)uVar8) {
        uVar7 = 0;
        uVar6 = 1;
        do {
          if (*(char *)((long)local_e8 + (long)*(int *)((long)pvVar3 + uVar7 * 4)) == '\0') {
            uVar6 = 0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      *(undefined1 *)((long)local_138.shared_alloc_.direct_ptr + lVar5) = uVar6;
      lVar5 = lVar5 + 1;
      pvVar3 = (void *)((long)pvVar3 + (long)(int)uVar8 * 4);
    } while (size_in != (int)lVar5);
    local_b0 = local_e8;
    mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_d0);
  }
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_98);
  local_118.shared_alloc_.alloc = local_138.shared_alloc_.alloc;
  local_118.shared_alloc_.direct_ptr = local_138.shared_alloc_.direct_ptr;
  if ((((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
       local_138.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_138.shared_alloc_.alloc)->use_count = (local_138.shared_alloc_.alloc)->use_count + -1;
    local_118.shared_alloc_.alloc = (Alloc *)((local_138.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_138.shared_alloc_.alloc = (Alloc *)0x0;
  local_138.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_118);
  pAVar2 = local_118.shared_alloc_.alloc;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_108);
  pAVar2 = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_138.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    piVar1 = &local_128->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128);
      operator_delete(pAVar2,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_up_all(
    Mesh* mesh, Int low_dim, Int high_dim, Read<I8> low_marked) {
  auto l2h = mesh->ask_down(high_dim, low_dim);
  auto deg = element_degree(mesh->family(), high_dim, low_dim);
  auto hl2l = l2h.ab2b;
  auto nh = mesh->nents(high_dim);
  Write<I8> out(nh, 0);
  auto f = OMEGA_H_LAMBDA(LO h) {
    bool all_marked = true;
    for (Int hhl = 0; hhl < deg; ++hhl) {
      auto l = hl2l[h * deg + hhl];
      if (!low_marked[l]) all_marked = false;
    }
    out[h] = I8(all_marked);
  };
  parallel_for(nh, f, "mark_up_all");
  return out;
}